

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O0

int eval_boolean(eval_info *info,coda_expression *expr,int *value)

{
  undefined8 uVar1;
  int64_t iVar2;
  coda_expression_node_type cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  pcre2_match_data_8 *match_data_00;
  long *in_FS_OFFSET;
  int index_id;
  int64_t prev_index;
  coda_cursor_conflict prev_cursor_3;
  int condition_3;
  int condition_2;
  long i_2;
  long size;
  long lStack_ce8;
  int condition_1;
  long i_1;
  long num_elements_1;
  coda_cursor_conflict prev_cursor_2;
  long lStack_9c0;
  int condition;
  long i;
  long num_elements;
  coda_cursor_conflict prev_cursor_1;
  coda_special_type special_type;
  coda_type_class type_class;
  coda_cursor_conflict prev_cursor;
  PCRE2_UCHAR8 buffer [256];
  pcre2_code_8 *ppStack_280;
  int rc;
  pcre2_code_8 *re;
  pcre2_match_data_8 *match_data;
  char *pattern;
  long pattern_length;
  long pattern_offset;
  char *matchstring;
  long matchstring_length;
  long matchstring_offset;
  size_t erroffset;
  double dStack_230;
  int errorcode;
  double a_21;
  double a_20;
  double a_19;
  double a_18;
  char *b_17;
  char *a_17;
  long len_b_5;
  long len_a_5;
  long off_b_5;
  long off_a_5;
  int64_t b_16;
  int64_t a_16;
  double b_15;
  double a_15;
  char *b_14;
  char *a_14;
  long len_b_4;
  long len_a_4;
  long off_b_4;
  long off_a_4;
  int64_t b_13;
  int64_t a_13;
  double b_12;
  double a_12;
  char *b_11;
  char *a_11;
  long len_b_3;
  long len_a_3;
  long off_b_3;
  long off_a_3;
  int64_t b_10;
  int64_t a_10;
  double b_9;
  double a_9;
  char *b_8;
  char *a_8;
  long len_b_2;
  long len_a_2;
  long off_b_2;
  long off_a_2;
  int64_t b_7;
  int64_t a_7;
  double b_6;
  double a_6;
  char *b_5;
  char *a_5;
  long len_b_1;
  long len_a_1;
  long off_b_1;
  long off_a_1;
  int64_t b_4;
  int64_t a_4;
  double b_3;
  double a_3;
  char *b_2;
  char *a_2;
  long len_b;
  long len_a;
  long off_b;
  long off_a;
  int64_t b_1;
  int64_t a_1;
  double b;
  double a;
  coda_expression_operation *opexpr;
  int *value_local;
  coda_expression *expr_local;
  eval_info *info_local;
  
  if (expr->tag == expr_constant_boolean) {
    *value = expr[1].tag;
    return 0;
  }
  a = (double)expr;
  opexpr = (coda_expression_operation *)value;
  value_local = (int *)expr;
  expr_local = (coda_expression *)info;
  switch(expr->tag) {
  case expr_array_all:
    if (info->orig_cursor == (coda_cursor_conflict *)0x0) {
      __assert_fail("info->orig_cursor != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                    ,0x4dc,"int eval_boolean(eval_info *, const coda_expression *, int *)");
    }
    memcpy(&num_elements,&info->cursor,0x310);
    iVar5 = eval_cursor((eval_info *)expr_local,*(coda_expression **)((long)a + 0x18));
    if (iVar5 != 0) {
      return -1;
    }
    iVar5 = coda_cursor_get_num_elements((coda_cursor_conflict *)&expr_local->is_constant,&i);
    if (iVar5 != 0) {
      return -1;
    }
    if (0 < i) {
      iVar5 = coda_cursor_goto_first_array_element((coda_cursor_conflict *)&expr_local->is_constant)
      ;
      if (iVar5 != 0) {
        return -1;
      }
      for (lStack_9c0 = 0; lStack_9c0 < i; lStack_9c0 = lStack_9c0 + 1) {
        iVar5 = eval_boolean((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),
                             (int *)((long)&prev_cursor_2.stack[0x1f].bit_offset + 4));
        if (iVar5 != 0) {
          return -1;
        }
        if (prev_cursor_2.stack[0x1f].bit_offset._4_4_ == 0) {
          opexpr->tag = expr_abs;
          return 0;
        }
        if ((lStack_9c0 < i + -1) &&
           (iVar5 = coda_cursor_goto_next_array_element
                              ((coda_cursor_conflict *)&expr_local->is_constant), iVar5 != 0)) {
          return -1;
        }
      }
    }
    opexpr->tag = expr_add;
    memcpy(&expr_local->is_constant,&num_elements,0x310);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                  ,0x599,"int eval_boolean(eval_info *, const coda_expression *, int *)");
  case expr_array_exists:
    if (info->orig_cursor == (coda_cursor_conflict *)0x0) {
      __assert_fail("info->orig_cursor != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                    ,0x50d,"int eval_boolean(eval_info *, const coda_expression *, int *)");
    }
    memcpy(&num_elements_1,&info->cursor,0x310);
    iVar5 = eval_cursor((eval_info *)expr_local,*(coda_expression **)((long)a + 0x18));
    if (iVar5 != 0) {
      return -1;
    }
    iVar5 = coda_cursor_get_num_elements((coda_cursor_conflict *)&expr_local->is_constant,&i_1);
    if (iVar5 != 0) {
      return -1;
    }
    if (0 < i_1) {
      iVar5 = coda_cursor_goto_first_array_element((coda_cursor_conflict *)&expr_local->is_constant)
      ;
      if (iVar5 != 0) {
        return -1;
      }
      for (lStack_ce8 = 0; lStack_ce8 < i_1; lStack_ce8 = lStack_ce8 + 1) {
        iVar5 = eval_boolean((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),
                             (int *)((long)&size + 4));
        if (iVar5 != 0) {
          return -1;
        }
        if (size._4_4_ != 0) {
          opexpr->tag = expr_add;
          return 0;
        }
        if ((lStack_ce8 < i_1 + -1) &&
           (iVar5 = coda_cursor_goto_next_array_element
                              ((coda_cursor_conflict *)&expr_local->is_constant), iVar5 != 0)) {
          return -1;
        }
      }
    }
    opexpr->tag = expr_abs;
    memcpy(&expr_local->is_constant,&num_elements_1,0x310);
    break;
  case expr_at:
    if (info->orig_cursor == (coda_cursor_conflict *)0x0) {
      __assert_fail("info->orig_cursor != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                    ,0x57a,"int eval_boolean(eval_info *, const coda_expression *, int *)");
    }
    memcpy(&prev_index,&info->cursor,0x310);
    iVar5 = eval_cursor((eval_info *)expr_local,*(coda_expression **)((long)a + 0x18));
    if (iVar5 != 0) {
      return -1;
    }
    iVar5 = eval_boolean((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),(int *)opexpr
                        );
    if (iVar5 != 0) {
      return -1;
    }
    memcpy(&expr_local->is_constant,&prev_index,0x310);
    break;
  case expr_equal:
    if ((*(int *)(*(long *)&expr[1].is_constant + 4) == 2) ||
       (*(int *)(*(long *)(expr + 2) + 4) == 2)) {
      iVar5 = eval_float(info,*(coda_expression **)&expr[1].is_constant,&b);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_float((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),
                         (double *)&a_1);
      if (iVar5 != 0) {
        return -1;
      }
      opexpr->tag = (uint)(b == (double)a_1);
    }
    else if (*(int *)(*(long *)&expr[1].is_constant + 4) == 1) {
      iVar5 = eval_integer(info,*(coda_expression **)&expr[1].is_constant,&b_1);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_integer((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),&off_a);
      if (iVar5 != 0) {
        return -1;
      }
      opexpr->tag = (uint)(b_1 == off_a);
    }
    else {
      if (*(int *)(*(long *)&expr[1].is_constant + 4) != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x2c5,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      iVar5 = eval_string(info,*(coda_expression **)&expr[1].is_constant,&off_b,&len_b,&b_2);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_string((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),&len_a,
                          (long *)&a_2,(char **)&a_3);
      if (iVar5 != 0) {
        free(b_2);
        return -1;
      }
      iVar5 = compare_strings(off_b,len_b,b_2,len_a,(long)a_2,(char *)a_3);
      opexpr->tag = (uint)(iVar5 == 0);
      if (0 < len_b) {
        free(b_2);
      }
      if (0 < (long)a_2) {
        free((void *)a_3);
      }
    }
    break;
  case expr_exists:
    if (info->orig_cursor == (coda_cursor_conflict *)0x0) {
      __assert_fail("info->orig_cursor != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                    ,0x4b2,"int eval_boolean(eval_info *, const coda_expression *, int *)");
    }
    memcpy(&special_type,&info->cursor,0x310);
    iVar5 = eval_cursor((eval_info *)expr_local,*(coda_expression **)((long)a + 0x18));
    if (iVar5 != 0) {
      if (*(int *)(*in_FS_OFFSET + -0x11f0) != -0x191) {
        *(undefined4 *)(*in_FS_OFFSET + -0x11f0) = 0;
        opexpr->tag = expr_abs;
        memcpy(&expr_local->is_constant,&special_type,0x310);
        return 0;
      }
      return -1;
    }
    iVar5 = coda_cursor_get_type_class
                      ((coda_cursor_conflict *)&expr_local->is_constant,
                       (coda_type_class *)((long)&prev_cursor_1.stack[0x1f].bit_offset + 4));
    if (iVar5 != 0) {
      return -1;
    }
    if (prev_cursor_1.stack[0x1f].bit_offset._4_4_ == 6) {
      iVar5 = coda_cursor_get_special_type
                        ((coda_cursor_conflict *)&expr_local->is_constant,
                         (coda_special_type *)&prev_cursor_1.stack[0x1f].bit_offset);
      if (iVar5 != 0) {
        return -1;
      }
      if ((int)prev_cursor_1.stack[0x1f].bit_offset == 0) {
        opexpr->tag = expr_abs;
        memcpy(&expr_local->is_constant,&special_type,0x310);
        return 0;
      }
    }
    opexpr->tag = expr_add;
    memcpy(&expr_local->is_constant,&special_type,0x310);
    break;
  case expr_greater_equal:
    if ((*(int *)(*(long *)&expr[1].is_constant + 4) == 2) ||
       (*(int *)(*(long *)(expr + 2) + 4) == 2)) {
      iVar5 = eval_float(info,*(coda_expression **)&expr[1].is_constant,&b_9);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_float((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),
                         (double *)&a_10);
      if (iVar5 != 0) {
        return -1;
      }
      opexpr->tag = (uint)((double)a_10 <= b_9);
    }
    else if (*(int *)(*(long *)&expr[1].is_constant + 4) == 1) {
      iVar5 = eval_integer(info,*(coda_expression **)&expr[1].is_constant,&b_10);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_integer((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),&off_a_3);
      if (iVar5 != 0) {
        return -1;
      }
      opexpr->tag = (uint)(off_a_3 <= b_10);
    }
    else {
      if (*(int *)(*(long *)&expr[1].is_constant + 4) != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x37f,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      iVar5 = eval_string(info,*(coda_expression **)&expr[1].is_constant,&off_b_3,&len_b_3,&b_11);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_string((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),&len_a_3,
                          (long *)&a_11,(char **)&a_12);
      if (iVar5 != 0) {
        free(b_11);
        return -1;
      }
      iVar5 = compare_strings(off_b_3,len_b_3,b_11,len_a_3,(long)a_11,(char *)a_12);
      opexpr->tag = (uint)(-1 < iVar5);
      if (0 < len_b_3) {
        free(b_11);
      }
      if (0 < (long)a_11) {
        free((void *)a_12);
      }
    }
    break;
  case expr_greater:
    if ((*(int *)(*(long *)&expr[1].is_constant + 4) == 2) ||
       (*(int *)(*(long *)(expr + 2) + 4) == 2)) {
      iVar5 = eval_float(info,*(coda_expression **)&expr[1].is_constant,&b_6);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_float((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),
                         (double *)&a_7);
      if (iVar5 != 0) {
        return -1;
      }
      opexpr->tag = (uint)((double)a_7 < b_6);
    }
    else if (*(int *)(*(long *)&expr[1].is_constant + 4) == 1) {
      iVar5 = eval_integer(info,*(coda_expression **)&expr[1].is_constant,&b_7);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_integer((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),&off_a_2);
      if (iVar5 != 0) {
        return -1;
      }
      opexpr->tag = (uint)(off_a_2 < b_7);
    }
    else {
      if (*(int *)(*(long *)&expr[1].is_constant + 4) != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x341,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      iVar5 = eval_string(info,*(coda_expression **)&expr[1].is_constant,&off_b_2,&len_b_2,&b_8);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_string((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),&len_a_2,
                          (long *)&a_8,(char **)&a_9);
      if (iVar5 != 0) {
        free(b_8);
        return -1;
      }
      iVar5 = compare_strings(off_b_2,len_b_2,b_8,len_a_2,(long)a_8,(char *)a_9);
      opexpr->tag = (uint)(0 < iVar5);
      if (0 < len_b_2) {
        free(b_8);
      }
      if (0 < (long)a_8) {
        free((void *)a_9);
      }
    }
    break;
  case expr_if:
    iVar5 = eval_boolean(info,*(coda_expression **)&expr[1].is_constant,
                         (int *)&prev_cursor_3.stack[0x1f].bit_offset);
    if (iVar5 != 0) {
      return -1;
    }
    if ((int)prev_cursor_3.stack[0x1f].bit_offset == 0) {
      iVar5 = eval_boolean((eval_info *)expr_local,*(coda_expression **)((long)a + 0x28),
                           (int *)opexpr);
      if (iVar5 != 0) {
        return -1;
      }
    }
    else {
      iVar5 = eval_boolean((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),
                           (int *)opexpr);
      if (iVar5 != 0) {
        return -1;
      }
    }
    break;
  case expr_isinf:
    iVar5 = eval_float(info,*(coda_expression **)&expr[1].is_constant,&a_20);
    if (iVar5 != 0) {
      return -1;
    }
    cVar3 = coda_isInf(a_20);
    opexpr->tag = cVar3;
    break;
  case expr_ismininf:
    iVar5 = eval_float(info,*(coda_expression **)&expr[1].is_constant,&stack0xfffffffffffffdd0);
    if (iVar5 != 0) {
      return -1;
    }
    cVar3 = coda_isMinInf(dStack_230);
    opexpr->tag = cVar3;
    break;
  case expr_isnan:
    iVar5 = eval_float(info,*(coda_expression **)&expr[1].is_constant,&a_19);
    if (iVar5 != 0) {
      return -1;
    }
    cVar3 = coda_isNaN(a_19);
    opexpr->tag = cVar3;
    break;
  case expr_isplusinf:
    iVar5 = eval_float(info,*(coda_expression **)&expr[1].is_constant,&a_21);
    if (iVar5 != 0) {
      return -1;
    }
    cVar3 = coda_isPlusInf(a_21);
    opexpr->tag = cVar3;
    break;
  case expr_less_equal:
    if ((*(int *)(*(long *)&expr[1].is_constant + 4) == 2) ||
       (*(int *)(*(long *)(expr + 2) + 4) == 2)) {
      iVar5 = eval_float(info,*(coda_expression **)&expr[1].is_constant,&b_15);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_float((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),
                         (double *)&a_16);
      if (iVar5 != 0) {
        return -1;
      }
      opexpr->tag = (uint)(b_15 <= (double)a_16);
    }
    else if (*(int *)(*(long *)&expr[1].is_constant + 4) == 1) {
      iVar5 = eval_integer(info,*(coda_expression **)&expr[1].is_constant,&b_16);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_integer((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),&off_a_5);
      if (iVar5 != 0) {
        return -1;
      }
      opexpr->tag = (uint)(b_16 <= off_a_5);
    }
    else {
      if (*(int *)(*(long *)&expr[1].is_constant + 4) != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x3fb,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      iVar5 = eval_string(info,*(coda_expression **)&expr[1].is_constant,&off_b_5,&len_b_5,&b_17);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_string((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),&len_a_5,
                          (long *)&a_17,(char **)&a_18);
      if (iVar5 != 0) {
        free(b_17);
        return -1;
      }
      iVar5 = compare_strings(off_b_5,len_b_5,b_17,len_a_5,(long)a_17,(char *)a_18);
      opexpr->tag = (uint)(iVar5 < 1);
      if (0 < len_b_5) {
        free(b_17);
      }
      if (0 < (long)a_17) {
        free((void *)a_18);
      }
    }
    break;
  case expr_less:
    if ((*(int *)(*(long *)&expr[1].is_constant + 4) == 2) ||
       (*(int *)(*(long *)(expr + 2) + 4) == 2)) {
      iVar5 = eval_float(info,*(coda_expression **)&expr[1].is_constant,&b_12);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_float((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),
                         (double *)&a_13);
      if (iVar5 != 0) {
        return -1;
      }
      opexpr->tag = (uint)(b_12 < (double)a_13);
    }
    else if (*(int *)(*(long *)&expr[1].is_constant + 4) == 1) {
      iVar5 = eval_integer(info,*(coda_expression **)&expr[1].is_constant,&b_13);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_integer((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),&off_a_4);
      if (iVar5 != 0) {
        return -1;
      }
      opexpr->tag = (uint)(b_13 < off_a_4);
    }
    else {
      if (*(int *)(*(long *)&expr[1].is_constant + 4) != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x3bd,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      iVar5 = eval_string(info,*(coda_expression **)&expr[1].is_constant,&off_b_4,&len_b_4,&b_14);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_string((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),&len_a_4,
                          (long *)&a_14,(char **)&a_15);
      if (iVar5 != 0) {
        free(b_14);
        return -1;
      }
      iVar5 = compare_strings(off_b_4,len_b_4,b_14,len_a_4,(long)a_14,(char *)a_15);
      opexpr->tag = (uint)(iVar5 < 0);
      if (0 < len_b_4) {
        free(b_14);
      }
      if (0 < (long)a_14) {
        free((void *)a_15);
      }
    }
    break;
  case expr_logical_and:
    iVar5 = eval_boolean(info,*(coda_expression **)&expr[1].is_constant,value);
    if (iVar5 != 0) {
      return -1;
    }
    if (opexpr->tag == expr_abs) {
      return 0;
    }
    iVar5 = eval_boolean((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),(int *)opexpr
                        );
    if (iVar5 != 0) {
      return -1;
    }
    break;
  case expr_logical_or:
    iVar5 = eval_boolean(info,*(coda_expression **)&expr[1].is_constant,value);
    if (iVar5 != 0) {
      return -1;
    }
    if (opexpr->tag != expr_abs) {
      return 0;
    }
    iVar5 = eval_boolean((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),(int *)opexpr
                        );
    if (iVar5 != 0) {
      return -1;
    }
    break;
  case expr_not_equal:
    if ((*(int *)(*(long *)&expr[1].is_constant + 4) == 2) ||
       (*(int *)(*(long *)(expr + 2) + 4) == 2)) {
      iVar5 = eval_float(info,*(coda_expression **)&expr[1].is_constant,&b_3);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_float((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),
                         (double *)&a_4);
      if (iVar5 != 0) {
        return -1;
      }
      opexpr->tag = (uint)(b_3 != (double)a_4);
    }
    else if (*(int *)(*(long *)&expr[1].is_constant + 4) == 1) {
      iVar5 = eval_integer(info,*(coda_expression **)&expr[1].is_constant,&b_4);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_integer((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),&off_a_1);
      if (iVar5 != 0) {
        return -1;
      }
      opexpr->tag = (uint)(b_4 != off_a_1);
    }
    else {
      if (*(int *)(*(long *)&expr[1].is_constant + 4) != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x303,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      iVar5 = eval_string(info,*(coda_expression **)&expr[1].is_constant,&off_b_1,&len_b_1,&b_5);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_string((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),&len_a_1,
                          (long *)&a_5,(char **)&a_6);
      if (iVar5 != 0) {
        free(b_5);
        return -1;
      }
      iVar5 = compare_strings(off_b_1,len_b_1,b_5,len_a_1,(long)a_5,(char *)a_6);
      opexpr->tag = (uint)(iVar5 != 0);
      if (0 < len_b_1) {
        free(b_5);
      }
      if (0 < (long)a_5) {
        free((void *)a_6);
      }
    }
    break;
  case expr_not:
    iVar5 = eval_boolean(info,*(coda_expression **)&expr[1].is_constant,value);
    if (iVar5 != 0) {
      return -1;
    }
    opexpr->tag = (uint)((opexpr->tag != expr_abs ^ 0xffU) & 1);
    break;
  case expr_regex:
    iVar5 = eval_string(info,*(coda_expression **)&expr[1].is_constant,&pattern_length,
                        (long *)&pattern,(char **)&match_data);
    if (iVar5 != 0) {
      return -1;
    }
    iVar5 = eval_string((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),
                        &matchstring_length,(long *)&matchstring,(char **)&pattern_offset);
    if (iVar5 != 0) {
      if (match_data != (pcre2_match_data_8 *)0x0) {
        free(match_data);
      }
      return -1;
    }
    if ((long)pattern < 1) {
      ppStack_280 = coda_pcre2_compile_8
                              ("",0,0x30,(int *)((long)&erroffset + 4),(size_t *)&matchstring_offset
                               ,(pcre2_compile_context_8 *)0x0);
    }
    else {
      ppStack_280 = coda_pcre2_compile_8
                              ((PCRE2_SPTR8)((long)match_data->ovector + pattern_length + -0x68),
                               (size_t)pattern,0x30,(int *)((long)&erroffset + 4),
                               (size_t *)&matchstring_offset,(pcre2_compile_context_8 *)0x0);
    }
    if (match_data != (pcre2_match_data_8 *)0x0) {
      free(match_data);
    }
    if (ppStack_280 == (pcre2_code_8 *)0x0) {
      coda_pcre2_get_error_message_8
                (erroffset._4_4_,(PCRE2_UCHAR8 *)&prev_cursor.stack[0x1f].bit_offset,0x100);
      coda_set_error(-0x191,"invalid format for regex pattern (\'%s\' at position %d)",
                     &prev_cursor.stack[0x1f].bit_offset,matchstring_offset);
      if (pattern_offset != 0) {
        free((void *)pattern_offset);
      }
      return -1;
    }
    if ((pattern_offset == 0) &&
       (pattern_offset = (long)strdup(""), (char *)pattern_offset == (char *)0x0)) {
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                     ,0x48c);
      coda_pcre2_code_free_8(ppStack_280);
      return -1;
    }
    match_data_00 =
         coda_pcre2_match_data_create_from_pattern_8(ppStack_280,(pcre2_general_context_8 *)0x0);
    if (match_data_00 == (pcre2_match_data_8 *)0x0) {
      coda_set_error(-1,"could not allocate regexp match data (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                     ,0x496);
      free((void *)pattern_offset);
      coda_pcre2_code_free_8(ppStack_280);
      return -1;
    }
    uVar4 = coda_pcre2_match_8(ppStack_280,(PCRE2_SPTR8)(pattern_offset + matchstring_length),
                               (size_t)matchstring,0,0,match_data_00,(pcre2_match_context_8 *)0x0);
    free((void *)pattern_offset);
    coda_pcre2_code_free_8(ppStack_280);
    coda_pcre2_match_data_free_8(match_data_00);
    if (((int)uVar4 < 0) && (uVar4 != 0xffffffff)) {
      coda_set_error(-0x191,"could not evaluate regex pattern (error code %d)",(ulong)uVar4);
      return -1;
    }
    if (uVar4 == 0) {
      coda_set_error(-0x191,"regex pattern contains too many subexpressions");
      return -1;
    }
    opexpr->tag = (uint)(0 < (int)uVar4);
    break;
  case expr_variable_exists:
    if (info->orig_cursor == (coda_cursor_conflict *)0x0) {
      __assert_fail("info->orig_cursor != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                    ,0x53e,"int eval_boolean(eval_info *, const coda_expression *, int *)");
    }
    if (info->variable_name != (char *)0x0) {
      coda_set_error(-0x191,"cannot perform search within search for product variables");
      return -1;
    }
    iVar5 = coda_product_variable_get_size(info->orig_cursor->product,*(char **)(expr + 1),&i_2);
    if (iVar5 != 0) {
      return -1;
    }
    uVar1 = *(undefined8 *)((long)a + 0x10);
    expr_local[0x33].is_constant = (int)uVar1;
    expr_local[0x33].recursion_depth = (int)((ulong)uVar1 >> 0x20);
    for (_condition_3 = 0; _condition_3 < i_2; _condition_3 = _condition_3 + 1) {
      expr_local[0x33].tag = condition_3;
      expr_local[0x33].result_type = condition_2;
      iVar5 = eval_boolean((eval_info *)expr_local,*(coda_expression **)((long)a + 0x18),
                           (int *)((long)&prev_cursor_3.stack[0x1f].bit_offset + 4));
      if (iVar5 != 0) {
        return -1;
      }
      if (prev_cursor_3.stack[0x1f].bit_offset._4_4_ != 0) {
        opexpr->tag = expr_add;
        expr_local[0x33].is_constant = 0;
        expr_local[0x33].recursion_depth = 0;
        return 0;
      }
    }
    opexpr->tag = expr_abs;
    expr_local[0x33].is_constant = 0;
    expr_local[0x33].recursion_depth = 0;
    break;
  case expr_with:
    iVar5 = **(char **)(expr + 1) + -0x69;
    iVar2 = info->index[iVar5];
    iVar6 = eval_integer(info,*(coda_expression **)&expr[1].is_constant,info->index + iVar5);
    if (iVar6 != 0) {
      return -1;
    }
    iVar6 = eval_boolean((eval_info *)expr_local,*(coda_expression **)((long)a + 0x20),(int *)opexpr
                        );
    if (iVar6 != 0) {
      return -1;
    }
    *(int64_t *)(&expr_local[0x31].is_constant + (long)iVar5 * 2) = iVar2;
  }
  return 0;
}

Assistant:

static int eval_boolean(eval_info *info, const coda_expression *expr, int *value)
{
    const coda_expression_operation *opexpr;

    if (expr->tag == expr_constant_boolean)
    {
        *value = ((coda_expression_bool_constant *)expr)->value;
        return 0;
    }

    opexpr = (const coda_expression_operation *)expr;
    switch (opexpr->tag)
    {
        case expr_equal:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a == b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a == b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) == 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_not_equal:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a != b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a != b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) != 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_greater:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a > b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a > b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) > 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_greater_equal:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a >= b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a >= b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) >= 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_less:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a < b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a < b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) < 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_less_equal:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a <= b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a <= b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) <= 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_not:
            if (eval_boolean(info, opexpr->operand[0], value) != 0)
            {
                return -1;
            }
            *value = !(*value);
            break;
        case expr_logical_and:
            if (eval_boolean(info, opexpr->operand[0], value) != 0)
            {
                return -1;
            }
            if (*value == 0)
            {
                return 0;
            }
            if (eval_boolean(info, opexpr->operand[1], value) != 0)
            {
                return -1;
            }
            break;
        case expr_logical_or:
            if (eval_boolean(info, opexpr->operand[0], value) != 0)
            {
                return -1;
            }
            if (*value != 0)
            {
                return 0;
            }
            if (eval_boolean(info, opexpr->operand[1], value) != 0)
            {
                return -1;
            }
            break;
        case expr_isnan:
            {
                double a;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                *value = coda_isNaN(a);
            }
            break;
        case expr_isinf:
            {
                double a;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                *value = coda_isInf(a);
            }
            break;
        case expr_isplusinf:
            {
                double a;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                *value = coda_isPlusInf(a);
            }
            break;
        case expr_ismininf:
            {
                double a;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                *value = coda_isMinInf(a);
            }
            break;
        case expr_regex:
            {
                int errorcode;
                PCRE2_SIZE erroffset;
                long matchstring_offset;
                long matchstring_length;
                char *matchstring;
                long pattern_offset;
                long pattern_length;
                char *pattern;
                pcre2_match_data *match_data;
                pcre2_code *re;
                int rc;

                if (eval_string(info, opexpr->operand[0], &pattern_offset, &pattern_length, &pattern) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &matchstring_offset, &matchstring_length, &matchstring) != 0)
                {
                    if (pattern != NULL)
                    {
                        free(pattern);
                    }
                    return -1;
                }

                if (pattern_length > 0)
                {
                    re = pcre2_compile((PCRE2_SPTR8)&pattern[pattern_offset], pattern_length,
                                       PCRE2_DOTALL | PCRE2_DOLLAR_ENDONLY, &errorcode, &erroffset, NULL);
                }
                else
                {
                    re = pcre2_compile((PCRE2_SPTR8)"", 0, PCRE2_DOTALL | PCRE2_DOLLAR_ENDONLY, &errorcode, &erroffset,
                                       NULL);
                }
                if (pattern != NULL)
                {
                    free(pattern);
                }
                if (re == NULL)
                {
                    PCRE2_UCHAR buffer[256];

                    pcre2_get_error_message(errorcode, buffer, sizeof(buffer));
                    coda_set_error(CODA_ERROR_EXPRESSION,
                                   "invalid format for regex pattern ('%s' at position %d)", buffer, erroffset);
                    if (matchstring != NULL)
                    {
                        free(matchstring);
                    }
                    return -1;
                }

                if (matchstring == NULL)
                {
                    /* pcre2_match does not except NULL for an empty matchstring */
                    matchstring = strdup("");
                    if (matchstring == NULL)
                    {
                        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)",
                                       __FILE__, __LINE__);
                        pcre2_code_free(re);
                        return -1;
                    }
                }

                match_data = pcre2_match_data_create_from_pattern(re, NULL);
                if (match_data == NULL)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "could not allocate regexp match data (%s:%u)",
                                   __FILE__, __LINE__);
                    free(matchstring);
                    pcre2_code_free(re);
                    return -1;
                }
                rc = pcre2_match(re, (PCRE2_SPTR8)&matchstring[matchstring_offset], matchstring_length, 0, 0,
                                 match_data, NULL);
                free(matchstring);
                pcre2_code_free(re);
                pcre2_match_data_free(match_data);
                if (rc < 0 && rc != PCRE2_ERROR_NOMATCH)
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "could not evaluate regex pattern (error code %d)", rc);
                    return -1;
                }
                if (rc == 0)
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "regex pattern contains too many subexpressions");
                    return -1;
                }
                *value = (rc > 0);
            }
            break;
        case expr_exists:
            {
                coda_cursor prev_cursor;
                coda_type_class type_class;

                assert(info->orig_cursor != NULL);
                prev_cursor = info->cursor;
                if (eval_cursor(info, opexpr->operand[0]) != 0)
                {
                    if (coda_errno != CODA_ERROR_EXPRESSION)
                    {
                        /* could not access path */
                        coda_errno = 0;
                        *value = 0;
                        info->cursor = prev_cursor;
                        return 0;
                    }
                    return -1;
                }
                if (coda_cursor_get_type_class(&info->cursor, &type_class) != 0)
                {
                    return -1;
                }
                if (type_class == coda_special_class)
                {
                    coda_special_type special_type;

                    if (coda_cursor_get_special_type(&info->cursor, &special_type) != 0)
                    {
                        return -1;
                    }
                    if (special_type == coda_special_no_data)
                    {
                        *value = 0;
                        info->cursor = prev_cursor;
                        return 0;
                    }
                }
                *value = 1;
                info->cursor = prev_cursor;
            }
            break;
        case expr_array_all:
            {
                coda_cursor prev_cursor;
                long num_elements;

                assert(info->orig_cursor != NULL);
                prev_cursor = info->cursor;
                if (eval_cursor(info, opexpr->operand[0]) != 0)
                {
                    return -1;
                }
                if (coda_cursor_get_num_elements(&info->cursor, &num_elements) != 0)
                {
                    return -1;
                }
                if (num_elements > 0)
                {
                    long i;

                    if (coda_cursor_goto_first_array_element(&info->cursor) != 0)
                    {
                        return -1;
                    }
                    for (i = 0; i < num_elements; i++)
                    {
                        int condition;

                        if (eval_boolean(info, opexpr->operand[1], &condition) != 0)
                        {
                            return -1;
                        }
                        if (!condition)
                        {
                            *value = 0;
                            return 0;
                        }
                        if (i < num_elements - 1)
                        {
                            if (coda_cursor_goto_next_array_element(&info->cursor) != 0)
                            {
                                return -1;
                            }
                        }
                    }
                }
                *value = 1;
                info->cursor = prev_cursor;
            }
            break;
        case expr_array_exists:
            {
                coda_cursor prev_cursor;
                long num_elements;

                assert(info->orig_cursor != NULL);
                prev_cursor = info->cursor;
                if (eval_cursor(info, opexpr->operand[0]) != 0)
                {
                    return -1;
                }
                if (coda_cursor_get_num_elements(&info->cursor, &num_elements) != 0)
                {
                    return -1;
                }
                if (num_elements > 0)
                {
                    long i;

                    if (coda_cursor_goto_first_array_element(&info->cursor) != 0)
                    {
                        return -1;
                    }
                    for (i = 0; i < num_elements; i++)
                    {
                        int condition;

                        if (eval_boolean(info, opexpr->operand[1], &condition) != 0)
                        {
                            return -1;
                        }
                        if (condition)
                        {
                            *value = 1;
                            return 0;
                        }
                        if (i < num_elements - 1)
                        {
                            if (coda_cursor_goto_next_array_element(&info->cursor) != 0)
                            {
                                return -1;
                            }
                        }
                    }
                }
                *value = 0;
                info->cursor = prev_cursor;
            }
            break;
        case expr_variable_exists:
            {
                long size;
                long i;

                assert(info->orig_cursor != NULL);
                if (info->variable_name != NULL)
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "cannot perform search within search for product variables");
                    return -1;
                }

                if (coda_product_variable_get_size(info->orig_cursor->product, opexpr->identifier, &size) != 0)
                {
                    return -1;
                }
                info->variable_name = opexpr->identifier;
                for (i = 0; i < size; i++)
                {
                    int condition;

                    info->variable_index = i;
                    if (eval_boolean(info, opexpr->operand[0], &condition) != 0)
                    {
                        return -1;
                    }
                    if (condition)
                    {
                        *value = 1;
                        info->variable_name = NULL;
                        return 0;
                    }
                }
                *value = 0;
                info->variable_name = NULL;
            }
            break;
        case expr_if:
            {
                int condition;

                if (eval_boolean(info, opexpr->operand[0], &condition) != 0)
                {
                    return -1;
                }
                if (condition)
                {
                    if (eval_boolean(info, opexpr->operand[1], value) != 0)
                    {
                        return -1;
                    }
                }
                else
                {
                    if (eval_boolean(info, opexpr->operand[2], value) != 0)
                    {
                        return -1;
                    }
                }
            }
            break;
        case expr_at:
            {
                coda_cursor prev_cursor;

                assert(info->orig_cursor != NULL);
                prev_cursor = info->cursor;
                if (eval_cursor(info, opexpr->operand[0]) != 0)
                {
                    return -1;
                }
                if (eval_boolean(info, opexpr->operand[1], value) != 0)
                {
                    return -1;
                }
                info->cursor = prev_cursor;
            }
            break;
        case expr_with:
            {
                int64_t prev_index;
                int index_id = opexpr->identifier[0] - 'i';

                prev_index = info->index[index_id];
                if (eval_integer(info, opexpr->operand[0], &info->index[index_id]) != 0)
                {
                    return -1;
                }
                if (eval_boolean(info, opexpr->operand[1], value) != 0)
                {
                    return -1;
                }
                info->index[index_id] = prev_index;
            }
            break;
        default:
            assert(0);
            exit(1);
    }

    return 0;
}